

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

Apply * __thiscall jsonnet::internal::Desugarer::length(Desugarer *this,AST *v)

{
  Apply *pAVar1;
  UString local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_40,L"length",L"");
  pAVar1 = stdFunc(this,&local_40,v);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  return pAVar1;
}

Assistant:

Apply *length(AST *v)
    {
        return stdFunc(U"length", v);
    }